

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QByteArray,QHashDummyValue>::emplace_helper<QHashDummyValue_const&>
          (QHash<QByteArray,QHashDummyValue> *this,QByteArray *key,QHashDummyValue *args)

{
  piter pVar1;
  long in_FS_OFFSET;
  InsertionResult local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.initialized = true;
  local_38._17_7_ = 0xaaaaaaaaaaaaaa;
  local_38.it.d = (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0xaaaaaaaaaaaaaaaa;
  local_38.it.bucket = 0xaaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::findOrInsert<QByteArray>
            (&local_38,*(Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> **)this,key);
  if (local_38.initialized == false) {
    QArrayDataPointer<char>::QArrayDataPointer
              ((QArrayDataPointer<char> *)
               ((local_38.it.d)->spans[local_38.it.bucket >> 7].entries +
               (local_38.it.d)->spans[local_38.it.bucket >> 7].offsets
               [(uint)local_38.it.bucket & 0x7f]),&key->d);
  }
  pVar1.bucket = local_38.it.bucket;
  pVar1.d = local_38.it.d;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }